

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_7fba::test_art_simple(void **param_1)

{
  art_val_t *paVar1;
  allocator_type *__a;
  size_t i;
  ulong uVar2;
  pointer val;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  art_t art;
  
  art.root = (art_node_t *)anon_var_dwarf_157;
  __a = (allocator_type *)&values;
  __l._M_len = 5;
  __l._M_array = (iterator)&art;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&keys,__l,__a);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&art;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_00,(allocator_type *)__a);
  art.root = (art_node_t *)0x0;
  val = values.
        super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
        ._M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2],(art_val_t *)val);
    val = val + 1;
  }
  paVar1 = art_find((art_t *)&art,
                    (art_key_chunk_t *)
                    *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  _assert_true((ulong)(*(uint64_t *)(paVar1[1].key + 2) ==
                      (values.
                       super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val),"*found_val == values[0]",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xad);
  paVar1 = art_erase((art_t *)&art,
                     (art_key_chunk_t *)
                     *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  _assert_true((ulong)(*(uint64_t *)(paVar1[1].key + 2) ==
                      (values.
                       super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val),"*erased_val == values[0]",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xaf);
  art_free((art_t *)&art);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

DEFINE_TEST(test_art_simple) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
    }
    Value* found_val = (Value*)art_find(&art, (uint8_t*)keys[0]);
    assert_true(*found_val == values[0]);
    Value* erased_val = (Value*)art_erase(&art, (uint8_t*)keys[0]);
    assert_true(*erased_val == values[0]);
    art_free(&art);
}